

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O2

void __thiscall libDAI::IJGP::IJGP(IJGP *this,FactorGraph *fg,Properties *opts)

{
  unsigned_long uVar1;
  pointer pBVar2;
  pointer pVVar3;
  undefined1 *puVar4;
  pointer pBVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  VarSet *pVVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar11;
  undefined4 extraout_var_03;
  size_type sVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer pdVar13;
  undefined4 extraout_var_07;
  size_t sVar14;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  size_t sVar15;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Var *pVVar16;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  long lVar17;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  Exception *this_00;
  long lVar18;
  pointer alpha_00;
  Bucket *this_01;
  IJGP *pIVar19;
  size_t i;
  pointer pBVar20;
  size_t alpha;
  pointer pdVar21;
  size_t I;
  ulong uVar22;
  pointer this_02;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> ElimOrder;
  FRegion local_368;
  vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *local_320;
  vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *local_318;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *local_310;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> minibuckets;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> buckets;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> mb_i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ElimSeq;
  VarSet Ivars;
  Var vi;
  VarSet local_218;
  VarSet local_1f8;
  ClusterGraph _cg;
  
  RegionGraph::RegionGraph((RegionGraph *)&_cg,fg);
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,(RegionGraph *)&_cg,opts);
  RegionGraph::~RegionGraph((RegionGraph *)&_cg);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061eb90;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310 = &this->_Qa;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  (this->Props).i = 0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318 = (vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&this->_Qb;
  local_320 = (vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&this->_mes
  ;
  bVar6 = initProps(this);
  if (bVar6) {
    uVar22 = 0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12ind.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12ind.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12ind.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb1.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb1.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb1.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V2.
    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V2.
    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V2.
    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x48))
                        ((long *)CONCAT44(extraout_var,iVar7));
      if (uVar9 <= uVar22) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar10 = (VarSet *)
                (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar7),uVar22);
      ClusterGraph::insert(&_cg,pVVar10);
      uVar22 = uVar22 + 1;
    }
    ClusterGraph::eraseNonMaximal(&_cg);
    ClusterGraph::MinFill(&ElimOrder,&_cg);
    ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&ElimSeq,(long)ElimOrder.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)ElimOrder.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start >> 4);
    lVar18 = 0;
    for (uVar22 = 0;
        uVar22 < (ulong)((long)ElimOrder.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)ElimOrder.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start >> 4); uVar22 = uVar22 + 1) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x40))
                              ((long *)CONCAT44(extraout_var_01,iVar7),
                               (long)&(ElimOrder.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_label + lVar18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&ElimSeq,(unsigned_long *)&local_368);
      lVar18 = lVar18 + 0x10;
    }
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_02,iVar7)) {
      poVar11 = std::operator<<((ostream *)&std::cout,"MinFill variable elimination order:");
      std::endl<char,std::char_traits<char>>(poVar11);
      lVar18 = 0;
      for (uVar22 = 0;
          uVar22 < (ulong)((long)ElimOrder.
                                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)ElimOrder.
                                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 4); uVar22 = uVar22 + 1
          ) {
        if (uVar22 != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        libDAI::operator<<((ostream *)&std::cout,
                           (Var *)((long)&(ElimOrder.
                                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_label +
                                  lVar18));
        lVar18 = lVar18 + 0x10;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    buckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    sVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x28))
                       ((long *)CONCAT44(extraout_var_03,iVar7));
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
              (&buckets,sVar12);
    uVar22 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x28))
                        ((long *)CONCAT44(extraout_var_04,iVar7));
      if (uVar9 <= uVar22) break;
      local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368.super_Factor._vs._statespace = uVar22;
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::
      emplace_back<libDAI::IJGP::Bucket>(&buckets,(Bucket *)&local_368);
      std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::~vector
                ((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *)
                 &local_368);
      uVar22 = uVar22 + 1;
    }
    minibuckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    minibuckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    minibuckets.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    sVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x28))
                       ((long *)CONCAT44(extraout_var_05,iVar7));
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
              (&minibuckets,sVar12);
    pdVar21 = (pointer)0x0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      pdVar13 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x48))
                                   ((long *)CONCAT44(extraout_var_06,iVar7));
      if (pdVar13 <= pdVar21) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      pVVar10 = (VarSet *)
                (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x50))
                          ((long *)CONCAT44(extraout_var_07,iVar7),pdVar21);
      pIVar19 = (IJGP *)&Ivars;
      VarSet::VarSet(&Ivars,pVVar10);
      sVar14 = findElimOrderIndex(pIVar19,&ElimOrder,&Ivars,0);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
      if (2 < CONCAT44(extraout_var_08,iVar7)) {
        poVar11 = libDAI::operator<<((ostream *)&std::cout,&Ivars);
        poVar11 = std::operator<<(poVar11,"->");
        poVar11 = libDAI::operator<<(poVar11,ElimOrder.
                                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                             ._M_impl.super__Vector_impl_data._M_start + sVar14);
        poVar11 = std::operator<<(poVar11," ");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      pBVar20 = buckets.
                super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                _M_impl.super__Vector_impl_data._M_start +
                ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar14];
      VarSet::VarSet(&local_1f8,&Ivars);
      VarSet::VarSet((VarSet *)&local_368,&local_1f8);
      local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_368.super_Factor._p._p.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,1);
      local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar21;
      std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
      emplace_back<libDAI::IJGP::BucketEntry>
                (&pBVar20->
                  super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ,(BucketEntry *)&local_368);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_1f8);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&Ivars);
      pdVar21 = (pointer)((long)pdVar21 + 1);
    }
    sVar12 = 0;
    sVar14 = 0;
    while( true ) {
      if ((ulong)((long)ElimOrder.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ElimOrder.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= sVar14) break;
      vi._label = ElimOrder.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar14]._label;
      vi._states = ElimOrder.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar14]._states;
      partitionBucket(&mb_i,this,
                      buckets.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[sVar14],(this->Props).i);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_09,iVar7)) {
        poVar11 = std::operator<<((ostream *)&std::cout,"number of minibuckets created: ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      lVar18 = 0;
      sVar12 = (sVar12 - 1) +
               ((long)mb_i.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)mb_i.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
      sVar14 = sVar14 + 1;
      for (uVar22 = 0;
          uVar22 < (ulong)((long)mb_i.
                                 super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)mb_i.
                                 super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar22 = uVar22 + 1) {
        std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::push_back
                  (&minibuckets,
                   (value_type *)
                   ((long)&((mb_i.
                             super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                           ).
                           super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar18));
        Bucket::vars(&Ivars,minibuckets.
                            super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this)
        ;
        if (2 < CONCAT44(extraout_var_10,iVar7)) {
          poVar11 = std::operator<<((ostream *)&std::cout,"  mb.vars = ");
          poVar11 = libDAI::operator<<(poVar11,&Ivars);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        pIVar19 = (IJGP *)&Ivars;
        VarSet::operator/=(&Ivars,&vi);
        if (Ivars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            Ivars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar15 = findElimOrderIndex(pIVar19,&ElimOrder,&Ivars,sVar14);
          uVar1 = ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar15];
          this_02 = buckets.
                    super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar1;
          VarSet::VarSet(&local_218,&Ivars);
          pBVar5 = minibuckets.
                   super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pBVar20 = minibuckets.
                    super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          VarSet::VarSet((VarSet *)&local_368,&local_218);
          local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_368.super_Factor._p._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start & 0xffffffffffffff00);
          local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(((long)pBVar5 - (long)pBVar20 >> 5) - 1);
          std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
          emplace_back<libDAI::IJGP::BucketEntry>
                    (&this_02->
                      super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                     ,(BucketEntry *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_218);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                            (this);
          sVar12 = sVar12 + 1;
          if (2 < CONCAT44(extraout_var_11,iVar7)) {
            poVar11 = std::operator<<((ostream *)&std::cout,"  added arc to bucket");
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            pVVar16 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar7) + 0x30))
                                       ((long *)CONCAT44(extraout_var_12,iVar7),uVar1);
            poVar11 = libDAI::operator<<(poVar11,pVVar16);
            poVar11 = std::operator<<(poVar11,", i.e. (");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,",");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,")");
            std::endl<char,std::char_traits<char>>(poVar11);
          }
        }
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&Ivars);
        lVar18 = lVar18 + 0x20;
      }
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector(&mb_i);
    }
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
              ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
               (CONCAT44(extraout_var_13,iVar7) + 0xe0),
               (long)minibuckets.
                     super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)minibuckets.
                     super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
              ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
               (CONCAT44(extraout_var_14,iVar7) + 0xf8),sVar12);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)(CONCAT44(extraout_var_15,iVar7) + 0x110),sVar12 * 2);
    alpha_00 = (pointer)0x0;
    while( true ) {
      pBVar20 = minibuckets.
                super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pointer)((long)minibuckets.
                          super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)minibuckets.
                          super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= alpha_00) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      this_01 = pBVar20 + (long)alpha_00;
      Bucket::vars((VarSet *)&mb_i,this_01);
      TFactor<double>::TFactor((TFactor<double> *)&Ivars,(VarSet *)&mb_i,1.0);
      TFactor<double>::TFactor(&local_368.super_Factor,(TFactor<double> *)&Ivars);
      local_368._c = 1.0;
      std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
                ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
                 (CONCAT44(extraout_var_16,iVar7) + 0xe0),&local_368);
      TFactor<double>::~TFactor(&local_368.super_Factor);
      TFactor<double>::~TFactor((TFactor<double> *)&Ivars);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&mb_i);
      lVar18 = 0x28;
      uVar22 = 0;
      while( true ) {
        pBVar2 = (this_01->
                 super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ).
                 super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = (long)(this_01->
                       super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                       ).
                       super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2;
        if ((ulong)(lVar17 / 0x30) <= uVar22) break;
        if (*(char *)((long)pBVar2 + lVar18 + -8) == '\x01') {
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          RegionGraph::setFac2OR
                    ((RegionGraph *)CONCAT44(extraout_var_17,iVar7),
                     *(size_t *)
                      ((long)&(((this_01->
                                super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                ).
                                super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_VarSet)._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar18),(size_t)alpha_00);
        }
        else {
          pVVar3 = *(pointer *)
                    ((long)&(pBVar2->super_VarSet)._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar18);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_19,iVar8) + 0x100) -
                         *(long *)(CONCAT44(extraout_var_19,iVar8) + 0xf8)) / 0x28);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = alpha_00;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(CONCAT44(extraout_var_18,iVar7) + 0x110),
                     (pair<unsigned_long,_unsigned_long> *)&local_368);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_21,iVar8) + 0x100) -
                         *(long *)(CONCAT44(extraout_var_21,iVar8) + 0xf8)) / 0x28);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = pVVar3;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(CONCAT44(extraout_var_20,iVar7) + 0x110),
                     (pair<unsigned_long,_unsigned_long> *)&local_368);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar17 = *(long *)(CONCAT44(extraout_var_23,iVar8) + 0xe0);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
          VarSet::operator&(&Ivars,(VarSet *)(lVar17 + (long)alpha_00 * 0x40),
                            (VarSet *)
                            ((long)pVVar3 * 0x40 + *(long *)(CONCAT44(extraout_var_24,iVar8) + 0xe0)
                            ));
          VarSet::VarSet((VarSet *)&local_368,&Ivars);
          local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
          std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::emplace_back<libDAI::Region>
                    ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                     (CONCAT44(extraout_var_22,iVar7) + 0xf8),(Region *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&Ivars);
        }
        uVar22 = uVar22 + 1;
        lVar18 = lVar18 + 0x30;
      }
      if (alpha_00 != (pointer)0x0) {
        puVar4 = (undefined1 *)((long)&alpha_00[-1]._states + 7);
        if (minibuckets.
            super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
            super__Vector_impl_data._M_start[(long)puVar4].var == this_01->var) {
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this,0x30,lVar17 % 0x30);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_26,iVar8) + 0x100) -
                         *(long *)(CONCAT44(extraout_var_26,iVar8) + 0xf8)) / 0x28);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = alpha_00;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(CONCAT44(extraout_var_25,iVar7) + 0x110),
                     (pair<unsigned_long,_unsigned_long> *)&local_368);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_28,iVar8) + 0x100) -
                         *(long *)(CONCAT44(extraout_var_28,iVar8) + 0xf8)) / 0x28);
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar4;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(CONCAT44(extraout_var_27,iVar7) + 0x110),
                     (pair<unsigned_long,_unsigned_long> *)&local_368);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          pVVar16 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar8) + 0x30))
                                     ((long *)CONCAT44(extraout_var_30,iVar8),this_01->var);
          VarSet::VarSet(&Ivars,pVVar16);
          VarSet::VarSet((VarSet *)&local_368,&Ivars);
          local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
          std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::emplace_back<libDAI::Region>
                    ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                     (CONCAT44(extraout_var_29,iVar7) + 0xf8),(Region *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368);
          std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                    ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&Ivars);
        }
      }
      alpha_00 = (pointer)((long)&alpha_00->_label + 1);
    }
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate
              ((BipartiteGraph<libDAI::FRegion,_libDAI::Region> *)
               (CONCAT44(extraout_var_31,iVar7) + 0xe0));
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    RegionGraph::RecomputeORs((RegionGraph *)CONCAT44(extraout_var_32,iVar7));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              (local_310);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              (local_310,
               *(long *)(CONCAT44(extraout_var_33,iVar7) + 0xe8) -
               *(long *)(CONCAT44(extraout_var_33,iVar7) + 0xe0) >> 6);
    lVar18 = 0;
    uVar22 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_34,iVar7) + 0xe8) -
                  *(long *)(CONCAT44(extraout_var_34,iVar7) + 0xe0) >> 6) <= uVar22) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                (local_310,
                 (value_type *)(*(long *)(CONCAT44(extraout_var_35,iVar7) + 0xe0) + lVar18));
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + 0x40;
    }
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               local_318);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               local_318,
               (*(long *)(CONCAT44(extraout_var_36,iVar7) + 0x100) -
               *(long *)(CONCAT44(extraout_var_36,iVar7) + 0xf8)) / 0x28);
    lVar18 = 0;
    uVar22 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)((*(long *)(CONCAT44(extraout_var_37,iVar7) + 0x100) -
                  *(long *)(CONCAT44(extraout_var_37,iVar7) + 0xf8)) / 0x28) <= uVar22) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_368.super_Factor,
                 (VarSet *)(*(long *)(CONCAT44(extraout_var_38,iVar7) + 0xf8) + lVar18),1.0);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>(local_318,&local_368.super_Factor);
      TFactor<double>::~TFactor(&local_368.super_Factor);
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + 0x28;
    }
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               local_320);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               local_320,
               *(long *)(CONCAT44(extraout_var_39,iVar7) + 0x118) -
               *(long *)(CONCAT44(extraout_var_39,iVar7) + 0x110) >> 4);
    lVar18 = 8;
    uVar22 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_40,iVar7) + 0x118) -
                  *(long *)(CONCAT44(extraout_var_40,iVar7) + 0x110) >> 4) <= uVar22) break;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_368.super_Factor,
                 (VarSet *)
                 (*(long *)(*(long *)(CONCAT44(extraout_var_42,iVar8) + 0x110) + lVar18) * 0x28 +
                 *(long *)(CONCAT44(extraout_var_41,iVar7) + 0xf8)),1.0);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>(local_320,&local_368.super_Factor);
      TFactor<double>::~TFactor(&local_368.super_Factor);
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + 0x10;
    }
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    RegionGraph::Check_Counting_Numbers((RegionGraph *)CONCAT44(extraout_var_43,iVar7));
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_44,iVar7)) {
      poVar11 = std::operator<<((ostream *)&std::cout,"Resulting regiongraph: ");
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      poVar11 = libDAI::operator<<(poVar11,(RegionGraph *)CONCAT44(extraout_var_45,iVar7));
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector(&minibuckets);
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector(&buckets);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&ElimSeq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              (&ElimOrder.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>);
    BipartiteGraph<libDAI::Var,_libDAI::VarSet>::~BipartiteGraph
              (&_cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_cg,"ijgp.cpp, line 68",(allocator<char> *)&local_368);
  Exception::Exception(this_00,8,(string *)&_cg);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IJGP::IJGP( const FactorGraph &fg, const Properties &opts ) : DAIAlgRG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _mes() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        ClusterGraph _cg;

        // Copy factor varsets
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _cg.insert( grm().factor(I).vars() );
        // Retain only maximal clusters
        _cg.eraseNonMaximal();
        // Obtain (heuristically) optimal elimination sequence
        vector<Var> ElimOrder = _cg.MinFill();
        vector<size_t> ElimSeq;
        ElimSeq.reserve( ElimOrder.size() );
        for( size_t i = 0; i < ElimOrder.size(); i++ )
            ElimSeq.push_back( grm().findVar(ElimOrder[i]) );
        if( Verbose() >= 3 ) {
            cout << "MinFill variable elimination order:" << endl;
            for( size_t i = 0; i < ElimOrder.size(); i++ ) {
                if( i != 0 )
                    cout << ", ";
                cout << ElimOrder[i];
            }
            cout << endl;
        }

        // Each variable has an associated bucket
        vector<Bucket> buckets;
        buckets.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            buckets.push_back( Bucket(i) );

        // Each minibucket will correspond to an outer region
        vector<Bucket> minibuckets;
        minibuckets.reserve( grm().nrVars() );

        // Place each factor in the bucket of the lowest (first-to-eliminate) index variable in its domain
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            VarSet Ivars = grm().factor(I).vars();
            size_t lowest = findElimOrderIndex( ElimOrder, Ivars );
            if( Verbose() >= 3 )
                cout << Ivars << "->" << ElimOrder[lowest] << " " << endl;

            buckets[ElimSeq[lowest]].push_back( BucketEntry( Ivars, true, I ) );
        }

        // For each bucket
        size_t nrArcs = 0;
        for( size_t _i = 0; _i < ElimOrder.size(); _i++ ) {
            Var vi = ElimOrder[_i];
            size_t i = ElimSeq[_i];

            // Partition bucket into mini-buckets
            vector<Bucket> mb_i = partitionBucket( buckets[i], Props.i );
            if( Verbose() >= 3 )
                cout << "number of minibuckets created: " << mb_i.size() << endl;
            nrArcs += mb_i.size() - 1;
            for( size_t mb_i_index = 0; mb_i_index < mb_i.size(); mb_i_index++ ) {
                minibuckets.push_back( mb_i[mb_i_index] );

                // Eliminate this variable
                VarSet vars = minibuckets.back().vars();
                if( Verbose() >= 3 )
                    cout << "  mb.vars = " << vars << endl;
                vars /= vi;
                if( vars.size() ) {
                    // Find lowest index variable in vars
                    size_t _j = findElimOrderIndex( ElimOrder, vars, _i+1 );
                    // j is the index of that variable
                    size_t j = ElimSeq[_j];
                    // Insert message into the corresponding bucket of j
                    buckets[j].push_back( BucketEntry(vars, false, minibuckets.size()-1 ) );
                    nrArcs++;
                    if( Verbose() >= 3 )
                        cout << "  added arc to bucket" << grm().var(j) << ", i.e. (" << _i << "," << _j << ")" << endl;
                }
            }
        }

        // Each minibucket becomes an outer region that contains the factors in that minibucket
        // For each message in the minibucket, we add an inner region (corresponding to an
        // arc of the join graph) and two edges
        // We also connect minibuckets of the same var with an inner region
        grm().ORs().reserve( minibuckets.size() );
        grm().IRs().reserve( nrArcs );
        grm().Redges().reserve( 2 * nrArcs );
        for( size_t alpha = 0; alpha < minibuckets.size(); alpha++ ) {
            Bucket & mb = minibuckets[alpha];
            grm().ORs().push_back( FRegion( Factor(mb.vars(), 1.0), 1.0 ) );
            for( size_t bE = 0; bE < mb.size(); bE++ )
                if( mb[bE].isFactor )
                    grm().setFac2OR( mb[bE].pointsTo, alpha );
                else {
                    size_t alpha2 = mb[bE].pointsTo;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().OR(alpha).vars() & grm().OR(alpha2).vars(), -1.0 ) );
                }
            if( alpha )
                if( minibuckets[alpha-1].var == mb.var ) {
                    size_t alpha2 = alpha - 1;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().var(mb.var), -1.0 ) );
                }
        }
        grm().Regenerate();
        grm().RecomputeORs();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 )
            cout << "Resulting regiongraph: " << grm() << endl;
    }